

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O0

int randomx_blake2b_init_param(blake2b_state *S,blake2b_param *P)

{
  uint64_t uVar1;
  byte *in_RSI;
  long in_RDI;
  uint i;
  uchar *p;
  undefined4 local_24;
  undefined4 local_4;
  
  if ((in_RSI == (byte *)0x0) || (in_RDI == 0)) {
    local_4 = -1;
  }
  else {
    blake2b_init0((blake2b_state *)0x1289ee);
    for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
      uVar1 = load64((void *)0x128a12);
      *(uint64_t *)(in_RDI + (ulong)local_24 * 8) = uVar1 ^ *(ulong *)(in_RDI + (ulong)local_24 * 8)
      ;
    }
    *(uint *)(in_RDI + 0xe4) = (uint)*in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int blake2b_init_param(blake2b_state *S, const blake2b_param *P) {
	const unsigned char *p = (const unsigned char *)P;
	unsigned int i;

	if (NULL == P || NULL == S) {
		return -1;
	}

	blake2b_init0(S);
	/* IV XOR Parameter Block */
	for (i = 0; i < 8; ++i) {
		S->h[i] ^= load64(&p[i * sizeof(S->h[i])]);
	}
	S->outlen = P->digest_length;
	return 0;
}